

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest1::NegativeTest1(NegativeTest1 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"subroutine_errors",
             "Verifies all GL_INVALID_OPERATION, GL_INVALID_VALUE, GL_INVALID ENUM errors related to subroutine usage are properly generated."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02129af0;
  this->m_has_test_passed = true;
  this->m_po_active_subroutine_uniform_locations = 0;
  this->m_po_active_subroutine_uniforms = 0;
  this->m_po_active_subroutines = 0;
  this->m_po_subroutine_uniform_function_index = -1;
  this->m_po_subroutine_uniform_function2_index = -1;
  this->m_po_subroutine_test1_index = 0xffffffff;
  this->m_po_subroutine_test2_index = 0xffffffff;
  this->m_po_subroutine_test3_index = 0xffffffff;
  this->m_po_not_linked_id = 0;
  this->m_po_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

NegativeTest1::NegativeTest1(deqp::Context& context)
	: TestCase(context, "subroutine_errors", "Verifies all GL_INVALID_OPERATION, GL_INVALID_VALUE, GL_INVALID ENUM "
											 "errors related to subroutine usage are properly generated.")
	, m_has_test_passed(true)
	, m_po_active_subroutine_uniform_locations(0)
	, m_po_active_subroutine_uniforms(0)
	, m_po_active_subroutines(0)
	, m_po_subroutine_uniform_function_index(-1)
	, m_po_subroutine_uniform_function2_index(-1)
	, m_po_subroutine_test1_index(GL_INVALID_INDEX)
	, m_po_subroutine_test2_index(GL_INVALID_INDEX)
	, m_po_subroutine_test3_index(GL_INVALID_INDEX)
	, m_po_not_linked_id(0)
	, m_po_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}